

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O2

bool check_phfr_params(CommandOptions *Options,PictureDescriptor *PDesc)

{
  int iVar1;
  Rational RVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  size_t sStack_20;
  
  RVar2 = CommandOptions::PictureRate(Options);
  iVar1 = RVar2.Numerator;
  iVar4 = RVar2.Denominator;
  if ((((ASDCP::EditRate_96 == iVar1) && (DAT_00116514 == iVar4)) ||
      ((ASDCP::EditRate_100 == iVar1 && (DAT_0011651c == iVar4)))) ||
     ((((ASDCP::EditRate_120 == iVar1 && (DAT_00116524 == iVar4)) ||
       ((ASDCP::EditRate_192 == iVar1 && (DAT_0011652c == iVar4)))) ||
      (((ASDCP::EditRate_200 == iVar1 && (DAT_00116534 == iVar4)) ||
       ((bVar3 = true, ASDCP::EditRate_240 == iVar1 && (DAT_0011653c == iVar4)))))))) {
    if (PDesc->StoredWidth < 0x801) {
      if (Options->use_smpte_labels != false) {
        if ((Options->picture_coding).super_Identifier<16U>.m_HasValue != false) {
          return true;
        }
        (Options->picture_coding).super_Identifier<16U>.m_HasValue = true;
        builtin_memcpy((Options->picture_coding).super_Identifier<16U>.m_Value,
                       "\x06\x0e+4\x04\x01\x01\r\x0e\x16\x02\x02\x03\x01\x01\x03",0x10);
        return true;
      }
      __ptr = "P-HFR files must be written using SMPTE labels. Use option \'-L\'.\n";
      sStack_20 = 0x41;
    }
    else {
      __ptr = "P-HFR files currently limited to 2K.\n";
      sStack_20 = 0x25;
    }
    fwrite(__ptr,sStack_20,1,_stderr);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
check_phfr_params(CommandOptions& Options, JP2K::PictureDescriptor& PDesc)
{
  Rational rate = Options.PictureRate();
  if ( rate != EditRate_96 && rate != EditRate_100 && rate != EditRate_120
       && rate != EditRate_192 && rate != EditRate_200 && rate != EditRate_240 )
    return true;

  if ( PDesc.StoredWidth > 2048 )
    {
      fprintf(stderr, "P-HFR files currently limited to 2K.\n");
      return false;
    }

  if ( ! Options.use_smpte_labels )
    {
      fprintf(stderr, "P-HFR files must be written using SMPTE labels. Use option '-L'.\n");
      return false;
    }

  // do not set the label if the user has already done so
  if ( ! Options.picture_coding.HasValue() )
    Options.picture_coding = UL(P_HFR_UL_2K);

  return true;
}